

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.cpp
# Opt level: O3

bool Unit_Test::verifyImage
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *value,bool isAnyValue)

{
  uint uVar1;
  uchar *puVar2;
  uchar *puVar3;
  imageException *this;
  ulong uVar4;
  ulong uVar5;
  uchar *puVar6;
  uchar *puVar7;
  uchar *puVar8;
  long lVar9;
  uchar *puVar10;
  
  if ((((height != 0) && (width != 0)) && (image->_data != (uchar *)0x0)) &&
     ((width + x <= image->_width && (height + y <= image->_height)))) {
    uVar1 = image->_rowSize;
    if (height * uVar1 != 0) {
      puVar2 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = (ulong)(width * image->_colorCount);
      puVar3 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      puVar6 = image->_data + (ulong)(x * image->_colorCount) + (ulong)(y * uVar1);
      puVar7 = puVar6 + height * uVar1;
      do {
        if (isAnyValue) {
          if (uVar4 != 0) {
            if (puVar2 == puVar3) {
              return false;
            }
            puVar8 = puVar6;
            do {
              puVar10 = puVar2;
              while (*puVar8 != *puVar10) {
                puVar10 = puVar10 + 1;
                if (puVar10 == puVar3) {
                  return false;
                }
              }
              puVar8 = puVar8 + 1;
            } while (puVar8 != puVar6 + uVar4);
          }
        }
        else if (uVar4 != 0) {
          uVar5 = 0;
          lVar9 = 0;
          do {
            if (puVar6[uVar5] != puVar2[lVar9]) {
              return false;
            }
            lVar9 = lVar9 + 1;
            if (lVar9 == (long)puVar3 - (long)puVar2) {
              lVar9 = 0;
            }
            uVar5 = uVar5 + 1;
          } while (uVar4 != uVar5);
        }
        puVar6 = puVar6 + uVar1;
      } while (puVar6 != puVar7);
    }
    return true;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Bad input parameters in image function");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

bool verifyImage( const PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height,
                      const std::vector < uint8_t > & value, bool isAnyValue )
    {
        if( image.empty() || width == 0 || height == 0 || x + width > image.width() || y + height > image.height() )
            throw imageException( "Bad input parameters in image function" );

        const uint32_t rowSize  = image.rowSize();
        const uint8_t * outputY = image.data() + y * rowSize + x * image.colorCount();
        const uint8_t * endY    = outputY + rowSize * height;

        width = width * image.colorCount();

        for ( ; outputY != endY; outputY += rowSize ) {
            const uint8_t * outputX = outputY;
            const uint8_t * endX    = outputX + width;

            if( isAnyValue ) {
                for( ; outputX != endX; ++outputX ) {
                    bool equal = false;

                    for( std::vector < uint8_t >::const_iterator v = value.begin(); v != value.end(); ++v ) {
                        if( (*outputX) == (*v) ) {
                            equal = true;
                            break;
                        }
                    }

                    if( !equal )
                        return false;
                }
            }
            else {
                size_t id = 0;
                for( ; outputX != endX; ++outputX ) {
                    if( (*outputX) != value[id++] )
                        return false;

                    if( id == value.size() )
                        id = 0;
                }
            }
        }

        return true;
    }